

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  ulong uVar7;
  size_t sVar8;
  Variable<tcu::Vector<float,_2>_> *pVVar9;
  Variable<vkt::shaderexecutor::Void> *pVVar10;
  size_type sVar11;
  SharedPtr<const_vkt::shaderexecutor::Statement> *this_00;
  Statement *this_01;
  Expr<float> *this_02;
  IVal *pIVar12;
  IRet *ret;
  double dStack_c0;
  double local_b8;
  ulong local_b0;
  size_t ndx;
  EvalContext funCtx;
  IArgs *mutArgs;
  Environment funEnv;
  IArgs *args_local;
  EvalContext *ctx_local;
  DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  Environment::Environment((Environment *)&mutArgs);
  sVar8 = funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tcu::Interval::Interval(__return_storage_ptr__);
  initialize(this);
  pVVar9 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                     (&(this->m_var0).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                     );
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&mutArgs,pVVar9,
             *(IVal **)funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var1).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&mutArgs,pVVar10,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var2).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&mutArgs,pVVar10,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var3).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&mutArgs,pVVar10,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18));
  EvalContext::EvalContext
            ((EvalContext *)&ndx,&ctx->format,ctx->floatPrecision,(Environment *)&mutArgs,
             ctx->callDepth);
  local_b0 = 0;
  while( true ) {
    uVar7 = local_b0;
    sVar11 = std::
             vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ::size(&this->m_body);
    if (sVar11 <= uVar7) break;
    this_00 = &std::
               vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ::operator[](&this->m_body,local_b0)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>;
    this_01 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->(this_00);
    Statement::execute(this_01,(EvalContext *)&ndx);
    local_b0 = local_b0 + 1;
  }
  this_02 = de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator->
                      ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&this->m_ret);
  Expr<float>::evaluate((IVal *)&ret,this_02,(EvalContext *)&ndx);
  __return_storage_ptr__->m_hi = local_b8;
  *(IRet **)__return_storage_ptr__ = ret;
  __return_storage_ptr__->m_lo = dStack_c0;
  pVVar9 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                     (&(this->m_var0).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                     );
  pIVar12 = Environment::lookup<tcu::Vector<float,2>>((Environment *)&mutArgs,pVVar9);
  puVar1 = *(undefined8 **)sVar8;
  uVar2 = *(undefined8 *)pIVar12->m_data;
  dVar3 = pIVar12->m_data[0].m_lo;
  dVar4 = pIVar12->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar12->m_data + 1);
  dVar6 = pIVar12->m_data[1].m_hi;
  puVar1[4] = pIVar12->m_data[1].m_lo;
  puVar1[5] = dVar6;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar2;
  puVar1[1] = dVar3;
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var1).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::lookup<vkt::shaderexecutor::Void>((Environment *)&mutArgs,pVVar10);
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var2).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::lookup<vkt::shaderexecutor::Void>((Environment *)&mutArgs,pVVar10);
  pVVar10 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
            operator*(&(this->m_var3).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     );
  Environment::lookup<vkt::shaderexecutor::Void>((Environment *)&mutArgs,pVVar10);
  Environment::~Environment((Environment *)&mutArgs);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}